

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

QRect __thiscall QFbCursor::drawCursor(QFbCursor *this,QPainter *painter)

{
  QRect QVar1;
  Representation RVar2;
  bool bVar3;
  byte bVar4;
  QPainter *this_00;
  QPlatformCursorImage *this_01;
  QImage *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QPoint mScreenOffset;
  QRect *in_stack_ffffffffffffff78;
  QRect *in_stack_ffffffffffffff80;
  QRect *r;
  QPoint *in_stack_ffffffffffffffb0;
  QRect *in_stack_ffffffffffffffb8;
  QRect local_40;
  undefined1 local_30 [16];
  QPoint local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[1].x1.m_i & 1) == 0) {
    QRect::QRect(in_stack_ffffffffffffff80);
  }
  else {
    *(undefined1 *)&in_RDI[4].x1.m_i = 0;
    r = in_RDI;
    bVar3 = QRect::isNull(in_stack_ffffffffffffff80);
    if (bVar3) {
      QRect::QRect(in_stack_ffffffffffffff80);
    }
    else {
      local_20.xp.m_i = -0x55555556;
      local_20.yp.m_i = -0x55555556;
      local_30 = (**(code **)(**(long **)&in_RDI[1].x2 + 0x68))();
      local_20 = QRect::topLeft(in_stack_ffffffffffffff78);
      local_40 = QRect::translated(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      this_00 = (QPainter *)(**(code **)(**(long **)&in_RDI[1].x2 + 0x68))();
      bVar4 = QRect::intersects((QRect *)&local_40);
      if (((bVar4 ^ 0xff) & 1) == 0) {
        RVar2.m_i = in_RDI[2].y1.m_i;
        in_RDI[3].x1 = (Representation)in_RDI[2].x1.m_i;
        in_RDI[3].y1 = (Representation)RVar2.m_i;
        RVar2.m_i = in_RDI[2].y2.m_i;
        in_RDI[3].x2 = (Representation)in_RDI[2].x2.m_i;
        in_RDI[3].y2 = (Representation)RVar2.m_i;
        this_01 = QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>
                  ::operator->((QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>
                                *)&in_RDI[4].x2);
        QPlatformCursorImage::image(this_01);
        QPainter::drawImage(this_00,r,in_RSI);
        *(undefined1 *)((long)&in_RDI[4].x1.m_i + 1) = 1;
        local_18._0_4_ = in_RDI[3].x1;
        local_18._4_4_ = in_RDI[3].y1;
        local_10._0_4_ = in_RDI[3].x2;
        local_10._4_4_ = in_RDI[3].y2;
      }
      else {
        QRect::QRect(in_stack_ffffffffffffff80);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.x2.m_i = (undefined4)local_10;
    QVar1.y2.m_i = local_10._4_4_;
    QVar1.x1.m_i = (undefined4)local_18;
    QVar1.y1.m_i = local_18._4_4_;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFbCursor::drawCursor(QPainter & painter)
{
    if (!mVisible)
        return QRect();

    mDirty = false;
    if (mCurrentRect.isNull())
        return QRect();

    // We need this because the cursor might be mDirty due to moving off mScreen
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    // global to local translation
    if (!mCurrentRect.translated(mScreenOffset).intersects(mScreen->geometry()))
        return QRect();

    mPrevRect = mCurrentRect;
    painter.drawImage(mPrevRect, *mCursorImage->image());
    mOnScreen = true;
    return mPrevRect;
}